

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# windows.c
# Opt level: O3

char query_key(char *query,int *count)

{
  char key;
  
  key = (*windowprocs.win_query_key)(query,count);
  log_query_key(key,count);
  if ((count == (int *)0x0) || (*count == 0xffffffff)) {
    pline("<%s: %c>",query,(ulong)(uint)(int)key);
  }
  else {
    pline("<%s: %d %c>",query,(ulong)(uint)*count,(ulong)(uint)(int)key);
  }
  suppress_more();
  return key;
}

Assistant:

char query_key(const char *query, int *count)
{
	char key;
	key = (*windowprocs.win_query_key)(query, count);
	log_query_key(key, count);

	if (count && *count != -1)
	    pline("<%s: %d %c>", query, *count, key);
	else
	    pline("<%s: %c>", query, key);
	suppress_more();

	return key;
}